

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall
cmMakefile::AppendCustomCommandToOutput
          (cmMakefile *this,string *output,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,cmImplicitDependsList *implicit_depends,cmCustomCommandLines *commandLines)

{
  pointer pcVar1;
  bool bVar2;
  _func_void *p_Var3;
  _func_void *local_108;
  undefined8 uStack_100;
  code *local_f8;
  undefined8 uStack_f0;
  cmMakefile *local_e8;
  long *local_e0;
  long local_d8;
  long local_d0 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a8;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_90;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  __uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_38;
  
  bVar2 = ValidateCustomCommand(this,commandLines);
  if (bVar2) {
    local_e0 = local_d0;
    pcVar1 = (output->_M_dataplus)._M_p;
    local_e8 = this;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e0,pcVar1,pcVar1 + output->_M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_c0,depends);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_a8,
             &implicit_depends->
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            );
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
              (&local_90,
               &commandLines->
                super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
    local_f8 = (code *)0x0;
    uStack_f0 = 0;
    local_108 = (_func_void *)0x0;
    uStack_100 = 0;
    p_Var3 = (_func_void *)operator_new(0x70);
    *(cmMakefile **)p_Var3 = local_e8;
    *(_func_void **)(p_Var3 + 8) = p_Var3 + 0x18;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(p_Var3 + 8),local_e0,local_d8 + (long)local_e0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(p_Var3 + 0x28),&local_c0);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(p_Var3 + 0x40),&local_a8);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
              ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)(p_Var3 + 0x58),
               &local_90);
    local_60 = std::
               _Function_handler<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmMakefile.cxx:1237:7)>
               ::_M_invoke;
    local_78._8_8_ = uStack_100;
    local_68 = std::
               _Function_handler<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmMakefile.cxx:1237:7)>
               ::_M_manager;
    local_f8 = (code *)0x0;
    uStack_f0 = 0;
    local_48 = (code *)0x0;
    uStack_40 = 0;
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    local_38._M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
         (tuple<cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)
         (_Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)0x0;
    local_108 = p_Var3;
    local_78._M_unused._M_function_pointer = p_Var3;
    AddGeneratorAction(this,(GeneratorAction *)&local_78);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
              ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_38);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
    if (local_f8 != (code *)0x0) {
      (*local_f8)(&local_108,&local_108,3);
    }
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_90);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c0);
    if (local_e0 != local_d0) {
      operator_delete(local_e0,local_d0[0] + 1);
    }
  }
  return;
}

Assistant:

void cmMakefile::AppendCustomCommandToOutput(
  const std::string& output, const std::vector<std::string>& depends,
  const cmImplicitDependsList& implicit_depends,
  const cmCustomCommandLines& commandLines)
{
  // Validate custom commands.
  if (this->ValidateCustomCommand(commandLines)) {
    // Dispatch command creation to allow generator expressions in outputs.
    this->AddGeneratorAction(
      [=](cmLocalGenerator& lg, const cmListFileBacktrace& lfbt) {
        BacktraceGuard guard(this->Backtrace, lfbt);
        detail::AppendCustomCommandToOutput(lg, lfbt, output, depends,
                                            implicit_depends, commandLines);
      });
  }
}